

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PMap * NewMap(PType *keytype,PType *valuetype)

{
  PMap *this;
  size_t bucket;
  size_t local_20;
  
  this = (PMap *)FTypeTable::FindType
                           (&TypeTable,PMap::RegistrationInfo.MyClass,(intptr_t)keytype,
                            (intptr_t)valuetype,&local_20);
  if (this == (PMap *)0x0) {
    this = (PMap *)DObject::operator_new(0x90);
    PMap::PMap(this,keytype,valuetype);
    FTypeTable::AddType(&TypeTable,(PType *)this,PMap::RegistrationInfo.MyClass,(intptr_t)keytype,
                        (intptr_t)valuetype,local_20);
  }
  return this;
}

Assistant:

PMap *NewMap(PType *keytype, PType *valuetype)
{
	size_t bucket;
	PType *maptype = TypeTable.FindType(RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, &bucket);
	if (maptype == NULL)
	{
		maptype = new PMap(keytype, valuetype);
		TypeTable.AddType(maptype, RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, bucket);
	}
	return (PMap *)maptype;
}